

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::invalid_maximum_work_group_counts
               (NegativeTestContext *ctx)

{
  pointer pcVar1;
  char *pcVar2;
  RenderContext *renderCtx;
  bool bVar3;
  ContextType ctxType;
  char *__s;
  mapped_type *pmVar4;
  InternalError *this;
  long lVar5;
  GLint workGroupCountZ;
  GLint workGroupCountY;
  GLint workGroupCountX;
  ComputeSource compSource;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  ShaderProgram program;
  int local_250;
  int local_24c;
  string local_248;
  uint local_228;
  value_type local_220;
  undefined1 local_200 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_170;
  undefined1 local_150 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_130;
  undefined1 local_100 [152];
  GLuint local_68;
  bool local_40;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x23);
  local_130._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_130._M_impl.super__Rb_tree_header._M_header;
  local_130._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_130._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_130._M_impl.super__Rb_tree_header._M_header._M_right =
       local_130._M_impl.super__Rb_tree_header._M_header._M_left;
  __s = glu::getGLSLVersionDeclaration(bVar3 | GLSL_VERSION_310_ES);
  pcVar1 = local_100 + 0x10;
  local_100._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"GLSL_VERSION_STRING","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_130,(key_type *)local_100);
  pcVar2 = (char *)pmVar4->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,pcVar2,(ulong)__s);
  if ((pointer)local_100._0_8_ != pcVar1) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,
             "${GLSL_VERSION_STRING}\nlayout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nvoid main (void)\n{\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_200,&local_248);
  tcu::StringTemplate::specialize
            ((string *)local_100,(StringTemplate *)local_200,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_130);
  local_228 = 5;
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_220,local_100._0_8_,(pointer)(local_100._8_8_ + local_100._0_8_));
  if ((pointer)local_100._0_8_ != pcVar1) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  renderCtx = ctx->m_renderCtx;
  memset(local_200,0,0xac);
  local_150._0_8_ = (pointer)0x0;
  local_150[8] = 0;
  local_150._9_7_ = 0;
  local_150[0x10] = 0;
  local_150._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_200 + (ulong)local_228 * 0x18),&local_220);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)local_100,renderCtx,(ProgramSources *)local_200);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_150);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_170);
  lVar5 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_200 + lVar5));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  glu::operator<<((ctx->super_CallLogWrapper).m_log,(ShaderProgram *)local_100);
  if (local_40 != false) {
    glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_68);
    NegativeTestContext::expectError(ctx,0);
    glu::CallLogWrapper::glGetIntegeri_v(&ctx->super_CallLogWrapper,0x91be,0,(GLint *)&local_248);
    NegativeTestContext::expectError(ctx,0);
    pcVar1 = local_200 + 0x10;
    local_200._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200,
               "GL_INVALID_VALUE is generated by glDispatchCompute if <numGroupsX> array is larger than the maximum work group count for the x dimension."
               ,"");
    NegativeTestContext::beginSection(ctx,(string *)local_200);
    if ((pointer)local_200._0_8_ != pcVar1) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    glu::CallLogWrapper::glDispatchCompute
              (&ctx->super_CallLogWrapper,(int)local_248._M_dataplus._M_p + 1,1,1);
    NegativeTestContext::expectError(ctx,0x501);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glGetIntegeri_v(&ctx->super_CallLogWrapper,0x91be,1,&local_24c);
    NegativeTestContext::expectError(ctx,0);
    local_200._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200,
               "GL_INVALID_VALUE is generated by glDispatchCompute if <numGroupsY> array is larger than the maximum work group count for the y dimension."
               ,"");
    NegativeTestContext::beginSection(ctx,(string *)local_200);
    if ((pointer)local_200._0_8_ != pcVar1) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    glu::CallLogWrapper::glDispatchCompute(&ctx->super_CallLogWrapper,1,local_24c + 1,1);
    NegativeTestContext::expectError(ctx,0x501);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glGetIntegeri_v(&ctx->super_CallLogWrapper,0x91be,2,&local_250);
    NegativeTestContext::expectError(ctx,0);
    local_200._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200,
               "GL_INVALID_VALUE is generated by glDispatchCompute if <numGroupsZ> array is larger than the maximum work group count for the z dimension."
               ,"");
    NegativeTestContext::beginSection(ctx,(string *)local_200);
    if ((pointer)local_200._0_8_ != pcVar1) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    glu::CallLogWrapper::glDispatchCompute(&ctx->super_CallLogWrapper,1,1,local_250 + 1);
    NegativeTestContext::expectError(ctx,0x501);
    NegativeTestContext::endSection(ctx);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_130);
    return;
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this,"failed to build program",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeComputeTests.cpp"
             ,0x256);
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void invalid_maximum_work_group_counts (NegativeTestContext& ctx)
{
	const bool					isES32	= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	map<string, string>			args;
	args["GLSL_VERSION_STRING"]			= isES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);

	const glu::ComputeSource	compSource(tcu::StringTemplate(computeShaderSource).specialize(args));
	glu::ShaderProgram			program(ctx.getRenderContext(), glu::ProgramSources() << compSource);

	tcu::TestLog& log = ctx.getLog();
	log << program;

	if (!program.isOk())
		TCU_THROW(InternalError, "failed to build program");

	ctx.glUseProgram(program.getProgram());
	ctx.expectError(GL_NO_ERROR);

	GLint workGroupCountX;
	ctx.glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_COUNT, (GLuint)0, &workGroupCountX);
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_VALUE is generated by glDispatchCompute if <numGroupsX> array is larger than the maximum work group count for the x dimension.");
	ctx.glDispatchCompute(workGroupCountX+1, 1, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	GLint workGroupCountY;
	ctx.glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_COUNT, (GLuint)1, &workGroupCountY);
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_VALUE is generated by glDispatchCompute if <numGroupsY> array is larger than the maximum work group count for the y dimension.");
	ctx.glDispatchCompute(1, workGroupCountY+1, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	GLint workGroupCountZ;
	ctx.glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_COUNT, (GLuint)2, &workGroupCountZ);
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_VALUE is generated by glDispatchCompute if <numGroupsZ> array is larger than the maximum work group count for the z dimension.");
	ctx.glDispatchCompute(1, 1, workGroupCountZ+1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}